

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sniff_csv.cpp
# Opt level: O2

void duckdb::CSVSnifferFunction::RegisterFunction(BuiltinFunctions *set)

{
  mapped_type *this;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_3f1;
  key_type local_3f0;
  LogicalType local_3d0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3b8;
  string local_3a0;
  TableFunction csv_sniffer;
  TableFunction local_1c8;
  
  ::std::__cxx11::string::string((string *)&local_3a0,"sniff_csv",(allocator *)&local_3d0);
  LogicalType::LogicalType((LogicalType *)&local_3f0,VARCHAR);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_3f0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_3b8,__l,&local_3f1);
  TableFunction::TableFunction
            (&csv_sniffer,&local_3a0,(vector<duckdb::LogicalType,_true> *)&local_3b8,
             CSVSniffFunction,CSVSniffBind,CSVSniffInitGlobal,(table_function_init_local_t)0x0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3b8);
  LogicalType::~LogicalType((LogicalType *)&local_3f0);
  ::std::__cxx11::string::~string((string *)&local_3a0);
  ReadCSVTableFunction::ReadCSVAddNamedParameters(&csv_sniffer);
  LogicalType::LogicalType(&local_3d0,BOOLEAN);
  ::std::__cxx11::string::string((string *)&local_3f0,"force_match",(allocator *)&local_3f1);
  this = ::std::__detail::
         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)&csv_sniffer.super_SimpleNamedParameterFunction.named_parameters,&local_3f0
                     );
  LogicalType::operator=(this,&local_3d0);
  ::std::__cxx11::string::~string((string *)&local_3f0);
  LogicalType::~LogicalType(&local_3d0);
  TableFunction::TableFunction(&local_1c8,&csv_sniffer);
  BuiltinFunctions::AddFunction(set,&local_1c8);
  TableFunction::~TableFunction(&local_1c8);
  TableFunction::~TableFunction(&csv_sniffer);
  return;
}

Assistant:

void CSVSnifferFunction::RegisterFunction(BuiltinFunctions &set) {
	TableFunction csv_sniffer("sniff_csv", {LogicalType::VARCHAR}, CSVSniffFunction, CSVSniffBind, CSVSniffInitGlobal);
	// Accept same options as the actual csv reader
	ReadCSVTableFunction::ReadCSVAddNamedParameters(csv_sniffer);
	csv_sniffer.named_parameters["force_match"] = LogicalType::BOOLEAN;
	set.AddFunction(csv_sniffer);
}